

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O3

int bstrchrp(const_bstring b,int c,int pos)

{
  uchar *puVar1;
  int iVar2;
  int iVar3;
  void *pvVar4;
  
  iVar3 = -1;
  if (((b != (const_bstring)0x0) && (puVar1 = b->data, puVar1 != (uchar *)0x0)) &&
     (iVar2 = b->slen - pos, -1 < pos && (iVar2 != 0 && pos <= b->slen))) {
    pvVar4 = memchr(puVar1 + (uint)pos,c & 0xff,(long)iVar2);
    if (pvVar4 != (void *)0x0) {
      iVar3 = (int)pvVar4 - (int)puVar1;
    }
  }
  return iVar3;
}

Assistant:

int bstrchrp (const_bstring b, int c, int pos) {
unsigned char * p;

	if (b == NULL || b->data == NULL || b->slen <= pos || pos < 0)
		return BSTR_ERR;
	p = (unsigned char *) bstr__memchr ((b->data + pos), (unsigned char) c,
		                                (b->slen - pos));
	if (p) return (int) (p - b->data);
	return BSTR_ERR;
}